

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tandem.hpp
# Opt level: O2

void tandem::detail::add_maximal_periodicities<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
               LZBlock *prev_block,LZBlock *block,uint32_t min_period,uint32_t max_period,
               LMRVector *result)

{
  uint i;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint n;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  deque<tandem::Repeat,std::allocator<tandem::Repeat>> *local_40;
  ulong local_38;
  
  i = block->pos;
  uVar3 = block->length;
  local_38 = (ulong)uVar3;
  local_48 = uVar3 + prev_block->length * 2;
  if (i <= local_48) {
    local_48 = i;
  }
  n = i - local_48;
  local_4c = uVar3 + i;
  local_44 = max_period;
  if (uVar3 < max_period) {
    local_44 = uVar3;
  }
  uVar3 = i - 1;
  local_58 = max_period;
  local_40 = (deque<tandem::Repeat,std::allocator<tandem::Repeat>> *)result;
  for (local_5c = min_period; local_5c <= local_44; local_5c = local_5c + 1) {
    uVar1 = backward_lce<std::__cxx11::string,unsigned_int>(str,uVar3,local_5c + uVar3,n);
    uVar2 = forward_lce<std::__cxx11::string,unsigned_int>(str,local_5c + i,i,local_4c);
    if (local_5c <= uVar2 + uVar1) {
      if (uVar2 + local_5c < (uint)local_38) {
        local_50 = i - uVar1;
        local_54 = uVar2 + local_5c + uVar1;
        std::deque<tandem::Repeat,std::allocator<tandem::Repeat>>::
        emplace_back<unsigned_int,unsigned_int,unsigned_int&>
                  (local_40,&local_50,&local_54,&local_5c);
      }
    }
  }
  if (local_48 < local_58) {
    local_58 = local_48;
  }
  while (min_period < local_58) {
    local_5c = min_period;
    uVar1 = backward_lce<std::__cxx11::string,unsigned_int>(str,~min_period + i,uVar3,n);
    uVar2 = forward_lce<std::__cxx11::string,unsigned_int>(str,i,i - local_5c,local_4c);
    if (local_5c <= uVar2 + uVar1) {
      local_50 = i - (uVar1 + local_5c);
      local_54 = uVar2 + uVar1 + local_5c;
      std::deque<tandem::Repeat,std::allocator<tandem::Repeat>>::
      emplace_back<unsigned_int,unsigned_int,unsigned_int&>(local_40,&local_50,&local_54,&local_5c);
    }
    min_period = local_5c + 1;
  }
  return;
}

Assistant:

void add_maximal_periodicities(const T& str, const LZBlock& prev_block, const LZBlock& block,
                               const std::uint32_t min_period, const std::uint32_t max_period,
                               LMRVector& result)
{
    const auto u   = block.pos;
    const auto n   = block.length;
    const auto m   = std::min(u, 2 * prev_block.length + n);
    const auto t   = u - m;
    const auto end = u + n;
    // rightmax periodicities
    for (auto j = min_period; j <= std::min(n, max_period); ++j) {
        const auto ls = backward_lce(str, u - 1, u + j - 1, t);
        const auto lp = forward_lce(str, u + j, u, end);
        if (ls + lp >= j && j + lp < n) {
            result.emplace_back(u - ls, j + lp + ls, j);
        }
    }
    // leftmax periodicities
    for (auto j = min_period; j < std::min(m, max_period); ++j) {
        const auto ls = backward_lce(str, u - j - 1, u - 1, t);
        const auto lp = forward_lce(str, u, u - j, end);
        if (ls + lp >= j) {
            result.emplace_back(u - (ls + j), j + lp + ls, j);
        }
    }
}